

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>
                 (long buffer,uint value,uint num_digits)

{
  byte bVar1;
  undefined1 *puVar2;
  long lStack_8;
  
  puVar2 = (undefined1 *)(buffer + (ulong)num_digits + -1);
  for (; 99 < value; value = value / 100) {
    *(undefined2 *)(puVar2 + -1) =
         *(undefined2 *)(basic_data<void>::DIGITS + ((ulong)value % 100) * 2);
    puVar2 = puVar2 + -2;
  }
  if (value < 10) {
    bVar1 = (byte)value | 0x30;
    lStack_8 = -1;
  }
  else {
    *puVar2 = basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
    bVar1 = basic_data<void>::DIGITS[(ulong)value * 2];
    lStack_8 = -2;
  }
  puVar2[lStack_8 + 1] = bVar1;
  return (char *)(buffer + (ulong)num_digits);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, unsigned num_digits,
                            ThousandsSep thousands_sep) {
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = data::DIGITS[index];
  return end;
}